

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O0

void __thiscall CThumbInstruction::writeTempData(CThumbInstruction *this,TempData *tempData)

{
  int64_t memoryAddress;
  undefined8 this_00;
  allocator<char> local_141;
  string local_140;
  int local_11c;
  char local_118 [4];
  int pos;
  char str [256];
  TempData *tempData_local;
  CThumbInstruction *this_local;
  
  str._248_8_ = tempData;
  local_11c = sprintf(local_118,"   %s",(this->Opcode).name);
  while (local_11c < 0xb) {
    local_118[local_11c] = ' ';
    local_11c = local_11c + 1;
  }
  local_118[local_11c] = '\0';
  FormatInstruction(this,(this->Opcode).mask,local_118 + local_11c);
  this_00 = str._248_8_;
  memoryAddress = this->RamPos;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,local_118,&local_141);
  TempData::writeLine((TempData *)this_00,memoryAddress,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

void CThumbInstruction::writeTempData(TempData& tempData) const
{
	char str[256];

	int pos = sprintf(str,"   %s",Opcode.name);
	while (pos < 11) str[pos++] = ' ';
	str[pos] = 0;
	FormatInstruction(Opcode.mask,&str[pos]);

	tempData.writeLine(RamPos,str);
}